

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<14,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int i;
  undefined8 in_RAX;
  bool bVar5;
  long lVar6;
  float *pfVar7;
  int col;
  long lVar8;
  float *pfVar9;
  int col_1;
  float fVar10;
  float fVar11;
  float fVar12;
  float afStack_88 [2];
  Mat4x2 m;
  Vector<float,_3> res;
  float fStack_54;
  Matrix<float,_2,_4> retVal;
  undefined8 local_28;
  float local_20;
  int aiStack_18 [5];
  undefined4 uStack_4;
  
  pfVar1 = afStack_88 + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar6 = 0;
    pfVar7 = afStack_88;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      lVar8 = 0;
      do {
        fVar10 = 1.0;
        if (lVar6 != lVar8) {
          fVar10 = 0.0;
        }
        pfVar7[lVar8 * 2] = fVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar6 = 1;
      pfVar7 = pfVar1;
      bVar4 = false;
    } while (bVar5);
    uVar2 = *(undefined8 *)evalCtx->in[0].m_data;
    uVar3 = *(undefined8 *)evalCtx->in[1].m_data;
    afStack_88[0] = (float)uVar2;
    afStack_88[1] = (float)((ulong)uVar2 >> 0x20);
    m.m_data.m_data[0].m_data[0] = (float)uVar3;
    m.m_data.m_data[0].m_data[1] = (float)((ulong)uVar3 >> 0x20);
    m.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    m.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[3].m_data;
    m.m_data.m_data[2].m_data[0] = m.m_data.m_data[2].m_data[0];
    m.m_data.m_data[2].m_data[1] = m.m_data.m_data[2].m_data[1];
    m.m_data.m_data[1].m_data[1] = evalCtx->in[2].m_data[1];
    m.m_data.m_data[1].m_data[0] = evalCtx->in[2].m_data[0];
  }
  else {
    m.m_data.m_data[1].m_data[0] = 0.0;
    m.m_data.m_data[1].m_data[1] = 0.0;
    m.m_data.m_data[2].m_data[0] = 0.0;
    m.m_data.m_data[2].m_data[1] = 0.0;
    afStack_88[0] = 0.0;
    afStack_88[1] = 0.0;
    m.m_data.m_data[0].m_data[0] = 0.0;
    m.m_data.m_data[0].m_data[1] = 0.0;
    lVar6 = 0;
    pfVar7 = afStack_88;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      lVar8 = 0;
      do {
        pfVar7[lVar8 * 2] = *(float *)((long)&s_constInMat4x2 + lVar6 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar6 = 0x10;
      pfVar7 = pfVar1;
      bVar4 = false;
    } while (bVar5);
  }
  local_28 = CONCAT44(m.m_data.m_data[0].m_data[0] + m.m_data.m_data[0].m_data[1] +
                      m.m_data.m_data[2].m_data[1],
                      afStack_88[1] + afStack_88[0] + m.m_data.m_data[2].m_data[0]);
  local_20 = m.m_data.m_data[1].m_data[1] + m.m_data.m_data[1].m_data[0];
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  fStack_54 = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  lVar6 = 0;
  pfVar7 = res.m_data + 2;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar8 = 0;
    do {
      fVar10 = 1.0;
      if (lVar6 != lVar8) {
        fVar10 = 0.0;
      }
      pfVar7[lVar8 * 2] = fVar10;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar6 = 1;
    pfVar7 = &fStack_54;
    bVar4 = false;
  } while (bVar5);
  pfVar7 = res.m_data + 2;
  pfVar9 = afStack_88;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar6 = 0;
    do {
      pfVar7[lVar6 * 2] = pfVar9[lVar6 * 2] + -1.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pfVar7 = &fStack_54;
    pfVar9 = pfVar1;
    bVar4 = false;
  } while (bVar5);
  fVar11 = retVal.m_data.m_data[2].m_data[0] + res.m_data[2] + fStack_54;
  fVar12 = retVal.m_data.m_data[2].m_data[1] +
           retVal.m_data.m_data[0].m_data[1] + retVal.m_data.m_data[0].m_data[0];
  retVal.m_data.m_data[3].m_data[0] = fVar11;
  retVal.m_data.m_data[3].m_data[1] = fVar12;
  m.m_data.m_data[3].m_data[0] = 0.0;
  m.m_data.m_data[3].m_data[1] = 0.0;
  res.m_data[0] = 0.0;
  lVar6 = 0;
  do {
    res.m_data[lVar6 + -2] =
         *(float *)((long)&local_28 + lVar6 * 4) + retVal.m_data.m_data[3].m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  stack0xfffffffffffffff8 = CONCAT44((int)((ulong)in_RAX >> 0x20),2);
  lVar6 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar6]] = res.m_data[lVar6 + -4];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}